

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool __thiscall
sentencepiece::string_util::lexical_cast<unsigned_int>
          (string_util *this,string_view arg,uint *result)

{
  size_t sVar1;
  istream *piVar2;
  char *__s;
  bool bVar3;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190 [4];
  byte abStack_170 [80];
  ios_base local_120 [264];
  
  __s = (char *)arg._M_len;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  }
  if ((abStack_170[*(long *)(local_190[0] + -0x18)] & 5) == 0) {
    piVar2 = std::istream::_M_extract<unsigned_int>((uint *)local_1a0);
    bVar3 = ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0;
  }
  else {
    bVar3 = false;
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return bVar3;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, Target *result) {
  std::stringstream ss;
  return (ss << arg.data() && ss >> *result);
}